

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnTableInitExpr(BinaryReaderIR *this,Index segment)

{
  Location local_98;
  Var local_78;
  unique_ptr<wabt::VarExpr<(wabt::ExprType)40>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)40>_>_>
  local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  Index local_1c;
  BinaryReaderIR *pBStack_18;
  Index segment_local;
  BinaryReaderIR *this_local;
  
  local_1c = segment;
  pBStack_18 = this;
  Location::Location(&local_98);
  Var::Var(&local_78,segment,&local_98);
  MakeUnique<wabt::VarExpr<(wabt::ExprType)40>,wabt::Var>((wabt *)&local_30,&local_78);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)40>,std::default_delete<wabt::VarExpr<(wabt::ExprType)40>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::
  unique_ptr<wabt::VarExpr<(wabt::ExprType)40>,_std::default_delete<wabt::VarExpr<(wabt::ExprType)40>_>_>
  ::~unique_ptr(&local_30);
  Var::~Var(&local_78);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnTableInitExpr(Index segment) {
  return AppendExpr(MakeUnique<TableInitExpr>(Var(segment)));
}